

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<double,_3>::TPZManVector(TPZManVector<double,_3> *this,TPZVec<double> *copy)

{
  ulong uVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  
  (this->super_TPZVec<double>).fStore = (double *)0x0;
  (this->super_TPZVec<double>).fNElements = 0;
  (this->super_TPZVec<double>).fNAlloc = 0;
  (this->super_TPZVec<double>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01819f98;
  uVar1 = copy->fNElements;
  if ((long)uVar1 < 4) {
    pdVar3 = this->fExtAlloc;
    (this->super_TPZVec<double>).fStore = pdVar3;
    (this->super_TPZVec<double>).fNElements = uVar1;
    (this->super_TPZVec<double>).fNAlloc = 0;
    if ((long)uVar1 < 1) {
      return;
    }
  }
  else {
    pdVar3 = (double *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    (this->super_TPZVec<double>).fStore = pdVar3;
    (this->super_TPZVec<double>).fNElements = uVar1;
    (this->super_TPZVec<double>).fNAlloc = uVar1;
  }
  pdVar2 = copy->fStore;
  uVar4 = 0;
  do {
    pdVar3[uVar4] = pdVar2[uVar4];
    uVar4 = uVar4 + 1;
  } while (uVar1 != uVar4);
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(
        const TPZVec<T> & copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= (int64_t) (sizeof (fExtAlloc) / sizeof (T))) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy[i];
    }
}